

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token __thiscall slang::parsing::Lexer::lexDollarSign(Lexer *this)

{
  TokenKind TVar1;
  uint32_t uVar2;
  Lexer *in_RDI;
  Token TVar3;
  TokenKind in_stack_0000001e;
  Lexer *in_stack_00000020;
  TokenKind in_stack_0000002e;
  Lexer *in_stack_00000030;
  TokenKind kind;
  string_view in_stack_fffffffffffffff0;
  
  scanIdentifier(in_RDI);
  uVar2 = lexemeLength(in_RDI);
  if (uVar2 == 1) {
    TVar3 = create<>(in_stack_00000020,in_stack_0000001e);
  }
  else {
    lexeme(in_RDI);
    TVar1 = LexerFacts::getSystemKeywordKind(in_stack_fffffffffffffff0);
    if (TVar1 == Unknown) {
      lexeme(in_RDI);
      parseKnownSystemName(in_stack_fffffffffffffff0);
      TVar3 = create<slang::parsing::KnownSystemName>
                        (in_stack_00000030,in_stack_0000002e,(KnownSystemName *)in_stack_00000020);
    }
    else {
      TVar3 = create<>(in_stack_00000020,in_stack_0000001e);
    }
  }
  return TVar3;
}

Assistant:

Token Lexer::lexDollarSign() {
    scanIdentifier();

    // if length is 1, we just have a dollar sign operator
    if (lexemeLength() == 1)
        return create(TokenKind::Dollar);

    // otherwise, we have a system identifier
    // check for system keywords
    TokenKind kind = LF::getSystemKeywordKind(lexeme());
    if (kind != TokenKind::Unknown)
        return create(kind);

    return create(TokenKind::SystemIdentifier, parseKnownSystemName(lexeme()));
}